

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  printf("SOEM (Simple Open EtherCAT Master)\nEEPROM tool\n");
  mode = 0;
  if (argc < 4) {
    printf("Usage: eepromtool ifname slave OPTION fname|alias\n");
    printf("ifname = eth0 for example\n");
    printf("slave = slave number in EtherCAT order 1..n\n");
    printf("    -i      display EEPROM information\n");
    printf("    -walias write slave alias\n");
    printf("    -r      read EEPROM, output binary format\n");
    printf("    -ri     read EEPROM, output Intel Hex format\n");
    printf("    -w      write EEPROM, input binary format\n");
    printf("    -wi     write EEPROM, input Intel Hex format\n");
  }
  else {
    slave = atoi(argv[2]);
    iVar1 = strncmp(argv[3],"-i",3);
    if (iVar1 == 0) {
      mode = 6;
    }
    if (4 < argc) {
      iVar1 = strncmp(argv[3],"-r",3);
      if (iVar1 == 0) {
        mode = 1;
      }
      iVar1 = strncmp(argv[3],"-ri",4);
      if (iVar1 == 0) {
        mode = 2;
      }
      iVar1 = strncmp(argv[3],"-w",3);
      if (iVar1 == 0) {
        mode = 3;
      }
      iVar1 = strncmp(argv[3],"-wi",4);
      if (iVar1 == 0) {
        mode = 4;
      }
      iVar1 = strncmp(argv[3],"-walias",8);
      if (iVar1 == 0) {
        mode = 5;
        alias = atoi(argv[4]);
      }
    }
    eepromtool(argv[1],slave,mode,argv[4]);
  }
  printf("End program\n");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   printf("SOEM (Simple Open EtherCAT Master)\nEEPROM tool\n");

   mode = MODE_NONE;
   if (argc > 3)
   {      
      slave = atoi(argv[2]);
      if ((strncmp(argv[3], "-i", sizeof("-i")) == 0))   mode = MODE_INFO;
      if (argc > 4)
      {
         if ((strncmp(argv[3], "-r", sizeof("-r")) == 0))   mode = MODE_READBIN;
         if ((strncmp(argv[3], "-ri", sizeof("-ri")) == 0)) mode = MODE_READINTEL;
         if ((strncmp(argv[3], "-w", sizeof("-w")) == 0))   mode = MODE_WRITEBIN;
         if ((strncmp(argv[3], "-wi", sizeof("-wi")) == 0)) mode = MODE_WRITEINTEL;
         if ((strncmp(argv[3], "-walias", sizeof("-walias")) == 0))
         {
            mode = MODE_WRITEALIAS;
            alias = atoi(argv[4]);
         }
      }
      /* start tool */
      eepromtool(argv[1],slave,mode,argv[4]);
   }
   else
   {
      printf("Usage: eepromtool ifname slave OPTION fname|alias\n");
      printf("ifname = eth0 for example\n");
      printf("slave = slave number in EtherCAT order 1..n\n");
      printf("    -i      display EEPROM information\n");
      printf("    -walias write slave alias\n");
      printf("    -r      read EEPROM, output binary format\n");
      printf("    -ri     read EEPROM, output Intel Hex format\n");
      printf("    -w      write EEPROM, input binary format\n");
      printf("    -wi     write EEPROM, input Intel Hex format\n");
   }   
   
   printf("End program\n");
   
   return (0);
}